

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5Parser.cpp
# Opt level: O0

void __thiscall Assimp::MD5::MD5Parser::ParseHeader(MD5Parser *this)

{
  char *pcVar1;
  ulong uVar2;
  bool bVar3;
  Logger *this_00;
  unsigned_long *puVar4;
  allocator local_51;
  unsigned_long local_50 [2];
  string local_40;
  char *local_20;
  char *sz;
  MD5Parser *pMStack_10;
  uint iVer;
  MD5Parser *this_local;
  
  pMStack_10 = this;
  SkipSpaces(this);
  bVar3 = TokenMatch<char>(&this->buffer,"MD5Version",10);
  if (!bVar3) {
    ReportError(this,"Invalid MD5 file: MD5Version tag has not been found");
  }
  SkipSpaces(this);
  sz._4_4_ = strtoul10(this->buffer,&this->buffer);
  if (sz._4_4_ != 10) {
    ReportError(this,"MD5 version tag is unknown (10 is expected)");
  }
  SkipLine(this);
  local_20 = this->buffer;
  do {
    pcVar1 = this->buffer;
    this->buffer = pcVar1 + 1;
    bVar3 = IsLineEnd<char>(*pcVar1);
  } while (((bVar3 ^ 0xffU) & 1) != 0);
  this_00 = DefaultLogger::get();
  pcVar1 = local_20;
  local_50[1] = 0x400;
  local_50[0] = (long)this->buffer - (long)local_20;
  puVar4 = std::min<unsigned_long>(local_50 + 1,local_50);
  uVar2 = *puVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,pcVar1,uVar2,&local_51);
  Logger::info(this_00,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  SkipSpacesAndLineEnd(this);
  return;
}

Assistant:

void MD5Parser::ParseHeader()
{
    // parse and validate the file version
    SkipSpaces();
    if (!TokenMatch(buffer,"MD5Version",10))    {
        ReportError("Invalid MD5 file: MD5Version tag has not been found");
    }
    SkipSpaces();
    unsigned int iVer = ::strtoul10(buffer,(const char**)&buffer);
    if (10 != iVer) {
        ReportError("MD5 version tag is unknown (10 is expected)");
    }
    SkipLine();

    // print the command line options to the console
    // FIX: can break the log length limit, so we need to be careful
    char* sz = buffer;
    while (!IsLineEnd( *buffer++));
    ASSIMP_LOG_INFO(std::string(sz,std::min((uintptr_t)MAX_LOG_MESSAGE_LENGTH, (uintptr_t)(buffer-sz))));
    SkipSpacesAndLineEnd();
}